

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O0

Vec_Int_t * Acec_TreeCarryMap(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Wec_t *vBoxes)

{
  int iVar1;
  int i_00;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  undefined4 local_38;
  int Box;
  int k;
  int i;
  Vec_Int_t *vLevel;
  Vec_Int_t *vMap;
  Vec_Wec_t *vBoxes_local;
  Vec_Int_t *vAdds_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_IntStartFull(iVar1);
  for (Box = 0; iVar1 = Vec_WecSize(vBoxes), Box < iVar1; Box = Box + 1) {
    p_01 = Vec_WecEntry(vBoxes,Box);
    for (local_38 = 0; iVar1 = Vec_IntSize(p_01), local_38 < iVar1; local_38 = local_38 + 1) {
      iVar1 = Vec_IntEntry(p_01,local_38);
      i_00 = Vec_IntEntry(vAdds,iVar1 * 6 + 4);
      Vec_IntWriteEntry(p_00,i_00,iVar1);
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Acec_TreeCarryMap( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes )
{
    Vec_Int_t * vMap = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel;
    int i, k, Box;
    Vec_WecForEachLevel( vBoxes, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, k )
            Vec_IntWriteEntry( vMap, Vec_IntEntry(vAdds, 6*Box+4), Box );
    return vMap;
}